

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O1

ssize_t compress_out(archive_write *a,void *buff,size_t s,la_zaction run)

{
  uchar *buf;
  void *pvVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uLong uVar5;
  size_t s_00;
  size_t sVar6;
  
  pvVar1 = a->format_data;
  if ((run == ARCHIVE_Z_FINISH) && (*(long *)((long)pvVar1 + 0x98) == 0 && s == 0)) {
    sVar6 = 0;
  }
  else {
    if ((s != 0) && ((*(uint *)((long)pvVar1 + 0x7c) & 1) != 0)) {
      uVar5 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x74),(uchar *)buff,(uint)s);
      *(int *)((long)pvVar1 + 0x74) = (int)uVar5;
    }
    *(void **)((long)pvVar1 + 0x88) = buff;
    *(size_t *)((long)pvVar1 + 0x90) = s;
    buf = (uchar *)((long)pvVar1 + 0x108);
LAB_00196544:
    do {
      if (*(int *)((long)pvVar1 + 200) == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (**(code **)((long)pvVar1 + 0xd8))(a,(long)pvVar1 + 0x88,run);
      }
      if (1 < uVar3) {
        return -0x1e;
      }
      if (*(long *)((long)pvVar1 + 0xa8) == 0) {
        iVar4 = write_to_temp(a,buf,0xf000);
        if (iVar4 != 0) {
          return -0x1e;
        }
        *(uchar **)((long)pvVar1 + 0xa0) = buf;
        *(undefined8 *)((long)pvVar1 + 0xa8) = 0xf000;
        if ((*(byte *)((long)pvVar1 + 0x7c) & 2) != 0) {
          uVar5 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x78),buf,0xf000);
          *(int *)((long)pvVar1 + 0x78) = (int)uVar5;
        }
        if ((run == ARCHIVE_Z_FINISH) && (uVar3 != 1)) goto LAB_00196544;
      }
    } while (*(long *)((long)pvVar1 + 0x90) != 0);
    sVar6 = s;
    if (run == ARCHIVE_Z_FINISH) {
      lVar2 = *(long *)((long)pvVar1 + 0xa8);
      s_00 = 0xf000 - lVar2;
      iVar4 = write_to_temp(a,buf,s_00);
      sVar6 = 0xffffffffffffffe2;
      if (((iVar4 == 0) && (sVar6 = s, lVar2 != 0xf000)) &&
         ((*(uint *)((long)pvVar1 + 0x7c) & 2) != 0)) {
        uVar5 = cm_zlib_crc32((ulong)*(uint *)((long)pvVar1 + 0x78),buf,(uint)s_00);
        *(int *)((long)pvVar1 + 0x78) = (int)uVar5;
      }
    }
  }
  return sVar6;
}

Assistant:

static ssize_t
compress_out(struct archive_write *a, const void *buff, size_t s,
    enum la_zaction run)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	int r;

	if (run == ARCHIVE_Z_FINISH && zip->stream.total_in == 0 && s == 0)
		return (0);

	if ((zip->crc32flg & PRECODE_CRC32) && s)
		zip->precode_crc32 = crc32(zip->precode_crc32, buff,
		    (unsigned)s);
	zip->stream.next_in = (const unsigned char *)buff;
	zip->stream.avail_in = s;
	for (;;) {
		/* Compress file data. */
		r = compression_code(&(a->archive), &(zip->stream), run);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			return (ARCHIVE_FATAL);
		if (zip->stream.avail_out == 0) {
			if (write_to_temp(a, zip->wbuff, sizeof(zip->wbuff))
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			zip->stream.next_out = zip->wbuff;
			zip->stream.avail_out = sizeof(zip->wbuff);
			if (zip->crc32flg & ENCODED_CRC32)
				zip->encoded_crc32 = crc32(zip->encoded_crc32,
				    zip->wbuff, sizeof(zip->wbuff));
			if (run == ARCHIVE_Z_FINISH && r != ARCHIVE_EOF)
				continue;
		}
		if (zip->stream.avail_in == 0)
			break;
	}
	if (run == ARCHIVE_Z_FINISH) {
		uint64_t bytes = sizeof(zip->wbuff) - zip->stream.avail_out;
		if (write_to_temp(a, zip->wbuff, (size_t)bytes) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if ((zip->crc32flg & ENCODED_CRC32) && bytes)
			zip->encoded_crc32 = crc32(zip->encoded_crc32,
			    zip->wbuff, (unsigned)bytes);
	}

	return (s);
}